

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

bool skip_utf8_bom(FILE *f)

{
  int iVar1;
  FILE *f_local;
  
  iVar1 = fgetc((FILE *)f);
  if (((iVar1 == 0xef) && (iVar1 = fgetc((FILE *)f), iVar1 == 0xbb)) &&
     (iVar1 = fgetc((FILE *)f), iVar1 == 0xbf)) {
    f_local._7_1_ = true;
  }
  else {
    rewind((FILE *)f);
    f_local._7_1_ = false;
  }
  return f_local._7_1_;
}

Assistant:

bool skip_utf8_bom(FILE *f) {

    // pretty straightforward, but works
    if (fgetc(f) == 0xEF) {
        if (fgetc(f) == 0xBB) {
            if (fgetc(f) == 0xBF) {
                return true;
            }
        }
    }

    rewind(f);
    return false;
}